

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

DataDrawerBase * __thiscall SVGChart::LineDataDrawer::Clone(LineDataDrawer *this)

{
  LineDataDrawer *this_00;
  
  this_00 = (LineDataDrawer *)operator_new(0xa8);
  LineDataDrawer(this_00,this);
  return &this_00->super_DataDrawerBase;
}

Assistant:

DataDrawerBase* LineDataDrawer::Clone () const {
        return new LineDataDrawer (*this);
    }